

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  int iVar1;
  U32 UVar2;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint of_1;
  uint ml_1;
  uint ll_1;
  uint lit_1;
  U32 bitCost_3;
  U32 scaleLog_3;
  FSE_CState_t ofstate;
  uint of;
  U32 bitCost_2;
  U32 scaleLog_2;
  FSE_CState_t mlstate;
  uint ml;
  U32 bitCost_1;
  U32 scaleLog_1;
  FSE_CState_t llstate;
  uint ll;
  U32 bitCost;
  U32 scaleLog;
  uint lit;
  int compressedLiterals;
  int optLevel_local;
  size_t srcSize_local;
  BYTE *src_local;
  optState_t *optPtr_local;
  
  iVar1 = ZSTD_compressedLiterals(optPtr);
  optPtr->priceType = zop_dynamic;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 0x401) {
      optPtr->priceType = zop_predef;
    }
    if ((optPtr->symbolCosts->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      if (iVar1 != 0) {
        optPtr->litSum = 0;
        for (bitCost = 0; bitCost < 0x100; bitCost = bitCost + 1) {
          llstate._28_4_ = HUF_getNbBits(optPtr->symbolCosts,bitCost);
          if (llstate._28_4_ == 0) {
            local_d4 = 1;
          }
          else {
            local_d4 = 1 << (0xbU - (char)llstate._28_4_ & 0x1f);
          }
          optPtr->litFreq[bitCost] = local_d4;
          optPtr->litSum = optPtr->litFreq[bitCost] + optPtr->litSum;
        }
      }
      FSE_initCState((FSE_CState_t *)&bitCost_1,(optPtr->symbolCosts->fse).litlengthCTable);
      optPtr->litLengthSum = 0;
      for (llstate.stateLog = 0; llstate.stateLog < 0x24; llstate.stateLog = llstate.stateLog + 1) {
        UVar2 = FSE_getMaxNbBits(llstate.stateTable,llstate.stateLog);
        if (UVar2 == 0) {
          local_d8 = 1;
        }
        else {
          local_d8 = 1 << (10U - (char)UVar2 & 0x1f);
        }
        optPtr->litLengthFreq[llstate.stateLog] = local_d8;
        optPtr->litLengthSum = optPtr->litLengthFreq[llstate.stateLog] + optPtr->litLengthSum;
      }
      FSE_initCState((FSE_CState_t *)&bitCost_2,(optPtr->symbolCosts->fse).matchlengthCTable);
      optPtr->matchLengthSum = 0;
      for (mlstate._28_4_ = 0; (uint)mlstate._28_4_ < 0x35; mlstate._28_4_ = mlstate._28_4_ + 1) {
        UVar2 = FSE_getMaxNbBits(mlstate.stateTable,mlstate._28_4_);
        if (UVar2 == 0) {
          local_dc = 1;
        }
        else {
          local_dc = 1 << (10U - (char)UVar2 & 0x1f);
        }
        optPtr->matchLengthFreq[(uint)mlstate._28_4_] = local_dc;
        optPtr->matchLengthSum =
             optPtr->matchLengthFreq[(uint)mlstate._28_4_] + optPtr->matchLengthSum;
      }
      FSE_initCState((FSE_CState_t *)&bitCost_3,(optPtr->symbolCosts->fse).offcodeCTable);
      optPtr->offCodeSum = 0;
      for (ofstate._28_4_ = 0; (uint)ofstate._28_4_ < 0x20; ofstate._28_4_ = ofstate._28_4_ + 1) {
        lit_1 = 10;
        ll_1 = FSE_getMaxNbBits(ofstate.stateTable,ofstate._28_4_);
        if (ll_1 == 0) {
          local_e0 = 1;
        }
        else {
          local_e0 = 1 << (10U - (char)ll_1 & 0x1f);
        }
        optPtr->offCodeFreq[(uint)ofstate._28_4_] = local_e0;
        optPtr->offCodeSum = optPtr->offCodeFreq[(uint)ofstate._28_4_] + optPtr->offCodeSum;
      }
    }
    else {
      if (iVar1 != 0) {
        ml_1 = 0xff;
        HIST_count_simple(optPtr->litFreq,&ml_1,src,srcSize);
        UVar2 = ZSTD_downscaleStat(optPtr->litFreq,0xff,1);
        optPtr->litSum = UVar2;
      }
      for (of_1 = 0; of_1 < 0x24; of_1 = of_1 + 1) {
        optPtr->litLengthFreq[of_1] = 1;
      }
      optPtr->litLengthSum = 0x24;
      for (local_cc = 0; local_cc < 0x35; local_cc = local_cc + 1) {
        optPtr->matchLengthFreq[local_cc] = 1;
      }
      optPtr->matchLengthSum = 0x35;
      for (local_d0 = 0; local_d0 < 0x20; local_d0 = local_d0 + 1) {
        optPtr->offCodeFreq[local_d0] = 1;
      }
      optPtr->offCodeSum = 0x20;
    }
  }
  else {
    if (iVar1 != 0) {
      UVar2 = ZSTD_downscaleStat(optPtr->litFreq,0xff,1);
      optPtr->litSum = UVar2;
    }
    UVar2 = ZSTD_downscaleStat(optPtr->litLengthFreq,0x23,0);
    optPtr->litLengthSum = UVar2;
    UVar2 = ZSTD_downscaleStat(optPtr->matchLengthFreq,0x34,0);
    optPtr->matchLengthSum = UVar2;
    UVar2 = ZSTD_downscaleStat(optPtr->offCodeFreq,0x1f,0);
    optPtr->offCodeSum = UVar2;
  }
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* first block : init */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {  /* heuristic */
            DEBUGLOG(5, "(srcSize <= ZSTD_PREDEF_THRESHOLD) => zop_predef");
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {
            /* huffman table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBits(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* not a dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
            }

            {   unsigned ll;
                for (ll=0; ll<=MaxLL; ll++)
                    optPtr->litLengthFreq[ll] = 1;
            }
            optPtr->litLengthSum = MaxLL+1;

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned of;
                for (of=0; of<=MaxOff; of++)
                    optPtr->offCodeFreq[of] = 1;
            }
            optPtr->offCodeSum = MaxOff+1;

        }

    } else {   /* new block : re-use previous statistics, scaled down */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
        optPtr->litLengthSum = ZSTD_downscaleStat(optPtr->litLengthFreq, MaxLL, 0);
        optPtr->matchLengthSum = ZSTD_downscaleStat(optPtr->matchLengthFreq, MaxML, 0);
        optPtr->offCodeSum = ZSTD_downscaleStat(optPtr->offCodeFreq, MaxOff, 0);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}